

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O0

void Assimp::SceneCombiner::Copy(aiLight **_dest,aiLight *src)

{
  aiLight *this;
  aiLight *dest;
  aiLight *src_local;
  aiLight **_dest_local;
  
  if ((_dest != (aiLight **)0x0) && (src != (aiLight *)0x0)) {
    this = (aiLight *)operator_new(0x46c);
    aiLight::aiLight(this);
    *_dest = this;
    memcpy(this,src,0x46c);
  }
  return;
}

Assistant:

void SceneCombiner::Copy(aiLight** _dest, const aiLight* src) {
    if ( nullptr == _dest || nullptr == src ) {
        return;
    }

    aiLight* dest = *_dest = new aiLight();

    // get a flat copy, that's already OK
    ::memcpy(dest,src,sizeof(aiLight));
}